

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnetunix.cpp
# Opt level: O0

void __thiscall OS_CoreSocket::~OS_CoreSocket(OS_CoreSocket *this)

{
  OS_CoreSocket *in_stack_00000010;
  
  ~OS_CoreSocket(in_stack_00000010);
  return;
}

Assistant:

OS_CoreSocket::~OS_CoreSocket()
{
    /* close the socket */
    close();

    /* release resources */
    if (ready_evt != 0)
        ready_evt->release_ref();
    if (blocked_evt != 0)
        blocked_evt->release_ref();
    if (mon_thread != 0)
        mon_thread->release_ref();
}